

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

realtype N_VDotProd_SensWrapper(N_Vector x,N_Vector y)

{
  long *plVar1;
  long lVar2;
  realtype rVar3;
  realtype rVar4;
  
  plVar1 = (long *)x->content;
  if ((int)plVar1[1] < 1) {
    rVar3 = 0.0;
  }
  else {
    rVar3 = 0.0;
    lVar2 = 0;
    do {
      rVar4 = N_VDotProd(*(N_Vector *)(*plVar1 + lVar2 * 8),*(N_Vector *)(*y->content + lVar2 * 8));
      rVar3 = rVar3 + rVar4;
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
    } while (lVar2 < (int)plVar1[1]);
  }
  return rVar3;
}

Assistant:

realtype N_VDotProd_SensWrapper(N_Vector x, N_Vector y)
{
  int i;
  realtype sum;

  sum = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++)
    sum += N_VDotProd(NV_VEC_SW(x,i), NV_VEC_SW(y,i));

  return(sum);
}